

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O1

int __thiscall sqlite::Connection::Stmt::bind(Stmt *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  sqlite3_stmt *psVar1;
  undefined8 uVar2;
  int iVar3;
  Logic_error *this_00;
  long *plVar4;
  char *pcVar5;
  long *plVar6;
  size_type *psVar7;
  undefined4 in_register_00000034;
  allocator local_b1;
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar1 = this->stmt_;
  iVar3 = bind_parameter_index(this,(string *)CONCAT44(in_register_00000034,__fd));
  uVar2._0_2_ = __addr->sa_family;
  uVar2._2_1_ = __addr->sa_data[0];
  uVar2._3_1_ = __addr->sa_data[1];
  uVar2._4_1_ = __addr->sa_data[2];
  uVar2._5_1_ = __addr->sa_data[3];
  uVar2._6_1_ = __addr->sa_data[4];
  uVar2._7_1_ = __addr->sa_data[5];
  iVar3 = sqlite3_bind_text(psVar1,iVar3,uVar2,*(undefined4 *)(__addr->sa_data + 6),
                            0xffffffffffffffff);
  if (iVar3 == 0) {
    return iVar3;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_50,"Error binding ",(string *)CONCAT44(in_register_00000034,__fd));
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_b0 == plVar6) {
    local_a0 = *plVar6;
    uStack_98 = (undefined4)plVar4[3];
    uStack_94 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar6;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  sqlite3_errmsg(this->db_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)*plVar4;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_90._M_dataplus._M_p == psVar7) {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90.field_2._8_4_ = (undefined4)plVar4[3];
    local_90.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar7;
  }
  local_90._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pcVar5 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_70,pcVar5,&local_b1);
  Logic_error::Logic_error(this_00,&local_90,&local_70,iVar3,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

void Connection::Stmt::bind(const std::string & name, const std::string & val)
    {
        int status = sqlite3_bind_text(stmt_, bind_parameter_index(name), val.c_str(), val.length(), SQLITE_TRANSIENT);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding " + name +
                ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }